

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  key_type kVar4;
  Message *message;
  AssertHelper *this_00;
  char *pcVar5;
  hasher hVar6;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  undefined4 in_stack_fffffffffffff468;
  int in_stack_fffffffffffff46c;
  value_type in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff474;
  value_type in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff47c;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff480;
  char *in_stack_fffffffffffff488;
  int line;
  undefined4 in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff494;
  undefined8 in_stack_fffffffffffff498;
  Type type;
  AssertHelper *in_stack_fffffffffffff4a0;
  Message *in_stack_fffffffffffff4e8;
  AssertHelper *in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff5b0;
  int local_8b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_8b0 [17];
  value_type local_794;
  int local_790;
  key_type local_78c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_788 [13];
  key_type local_6b4;
  char *local_6b0;
  undefined4 local_6a4;
  AssertionResult local_6a0 [2];
  key_type local_67c;
  AssertHelper *local_678;
  undefined4 local_66c;
  AssertionResult local_668 [2];
  size_type local_648;
  undefined4 local_63c;
  AssertionResult local_638 [2];
  size_type local_618;
  undefined4 local_60c;
  AssertionResult local_608 [2];
  Message *local_5e8;
  int local_5e0;
  Message *local_5d8;
  int local_5d0;
  int local_5c8;
  undefined4 local_5c4;
  AssertionResult local_5c0 [2];
  Hasher local_5a0;
  Hasher local_590;
  int local_580;
  undefined4 local_57c;
  AssertionResult local_578 [2];
  key_type local_558;
  key_type local_554;
  AssertionResult local_550 [2];
  key_type local_530;
  key_type local_52c;
  AssertionResult local_528 [2];
  key_type local_504;
  size_type local_500;
  undefined4 local_4f4;
  AssertionResult local_4f0 [2];
  key_type local_4cc;
  size_type local_4c8;
  undefined4 local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_424;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  key_type local_3ec;
  size_type local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  size_type local_3b8;
  undefined4 local_3ac;
  AssertionResult local_3a8 [2];
  size_type local_388;
  undefined4 local_37c;
  AssertionResult local_378 [2];
  undefined4 local_354;
  size_type local_350;
  AssertionResult local_348 [2];
  size_type local_328;
  AssertionResult local_320 [2];
  Hasher local_300;
  Hasher local_2f0;
  int local_2e0;
  undefined4 local_2dc;
  AssertionResult local_2d8 [2];
  Hasher local_2b8;
  Hasher local_2a8;
  int local_298;
  undefined4 local_294;
  AssertionResult local_290 [2];
  Hasher local_270;
  Hasher local_260;
  int local_250;
  undefined4 local_24c;
  AssertionResult local_248 [2];
  Hasher local_228;
  Hasher local_218;
  int local_208;
  undefined4 local_204;
  AssertionResult local_200 [2];
  key_type local_1e0;
  key_type local_1dc;
  AssertionResult local_1d8 [2];
  key_type local_1b8;
  key_type local_1b4;
  AssertionResult local_1b0;
  size_type local_1a0;
  value_type local_140;
  key_type local_13c;
  value_type local_dc;
  int local_d8;
  key_type local_d4;
  key_type local_d0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c0 [12];
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff46c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_c0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
             (size_type)in_stack_fffffffffffff488,(hasher *)in_stack_fffffffffffff480,
             (key_equal *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_c0);
  local_d0 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                         in_stack_fffffffffffff46c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                    (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  local_d4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                         in_stack_fffffffffffff46c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                    (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  for (local_d8 = 3; type = (Type)((ulong)in_stack_fffffffffffff498 >> 0x20), local_d8 < 2000;
      local_d8 = local_d8 + 1) {
    local_dc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                              in_stack_fffffffffffff46c);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff5b0,
             (value_type *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  }
  local_13c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
          (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  local_140 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                             in_stack_fffffffffffff46c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff5b0,
           (value_type *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  local_1a0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbcf012);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
         (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  local_1b4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_1b8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbcf081);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf0f9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf15c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcf1cd);
  local_1dc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_1e0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbcf203);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf28d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcf361);
  local_204 = 1;
  local_228 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff480);
  local_218 = local_228;
  local_208 = Hasher::id(&local_218);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf451);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf4b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcf525);
  local_24c = 0;
  local_270 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff480);
  local_260 = local_270;
  local_250 = Hasher::id(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf611);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf674);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcf6e5);
  local_294 = 1;
  local_2b8 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_fffffffffffff480);
  local_2a8 = local_2b8;
  local_298 = Hasher::id(&local_2a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf7d5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcf8a9);
  local_2dc = 0;
  local_300 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_fffffffffffff480);
  local_2f0 = local_300;
  local_2e0 = Hasher::id(&local_2f0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcf995);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcf9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcfa66);
  local_328 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbcfa77);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcfb04);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcfb67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcfbd8);
  local_350 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbcfbe5);
  local_354 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (uint *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcfc7d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcfce0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcfd51);
  local_37c = 1;
  local_388 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbcfd6d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_378);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcfdfa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcfe5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbcfece);
  local_3ac = 0x7cc;
  local_3b8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbcfee6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbcff73);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbcffd6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0047);
  local_3dc = 0;
  local_3ec = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_3e8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff5b0 =
         (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbd012c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd018f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0200);
  local_414 = 1;
  kVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      in_stack_fffffffffffff46c);
  local_424 = kVar2;
  local_420 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd02d6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd0339);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd03aa);
  local_44c = 1;
  local_45c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_458 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd048f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd04f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0563);
  local_484 = 0;
  local_494 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_490 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd0639);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd069c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd070d);
  local_4bc = 0;
  local_4cc = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_4c8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd07f2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd0855);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd08c6);
  local_4f4 = 0;
  local_504 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_500 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd099c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd09ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0a70);
  google::
  swap<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             (HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  local_52c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_530 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd0ac5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd0b4f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd0bb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0c23);
  local_554 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  local_558 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd0c59);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd0ce3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd0d46);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0db7);
  local_57c = 0;
  local_5a0 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff480);
  local_590 = local_5a0;
  local_580 = Hasher::id(&local_590);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_578);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff4f0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbd0ea7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd0f0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd0f7b);
  local_5c4 = 1;
  hVar6 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_fffffffffffff480);
  local_5e0 = hVar6.super_Hasher.num_compares_;
  message = hVar6.super_Hasher._0_8_;
  local_5e8 = message;
  local_5d8 = message;
  local_5d0 = local_5e0;
  local_5c8 = Hasher::id((Hasher *)&local_5d8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (int *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (int *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd1061);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd10be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd112f);
  local_60c = 0x7cc;
  local_618 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd114b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_608);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd11d2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd122f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd129d);
  local_63c = 1;
  local_648 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd12b5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_638);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd133c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,type,
               (char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd1399);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd140a);
  local_66c = 1;
  local_67c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                          in_stack_fffffffffffff46c);
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                    (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  local_678 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff488,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  line = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xbd14dd);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               line,(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd153a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd15ab);
  local_6a4 = 0;
  kVar3 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      in_stack_fffffffffffff46c);
  local_6b4 = kVar3;
  pcVar5 = (char *)google::
                   BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::count((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                           (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                          );
  local_6b0 = pcVar5;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar5,(char *)in_stack_fffffffffffff480,
             (uint *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff480 =
         (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbd1675);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT44(kVar3,in_stack_fffffffffffff490),
               (int)((ulong)pcVar5 >> 0x20),(char *)in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4f0,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0xbd16d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd1743);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff46c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff46c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_788,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(kVar3,in_stack_fffffffffffff490),(size_type)pcVar5,
             (hasher *)in_stack_fffffffffffff480,
             (key_equal *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_788);
  kVar4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      in_stack_fffffffffffff46c);
  local_78c = kVar4;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                    (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  for (local_790 = 2; local_790 < 10000; local_790 = local_790 + 1) {
    in_stack_fffffffffffff478 =
         HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                        in_stack_fffffffffffff46c);
    local_794 = in_stack_fffffffffffff478;
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff5b0,(value_type *)CONCAT44(kVar2,in_stack_fffffffffffff5a8));
  }
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff46c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
             in_stack_fffffffffffff46c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_8b0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(kVar3,in_stack_fffffffffffff490),(size_type)pcVar5,
             (hasher *)in_stack_fffffffffffff480,
             (key_equal *)CONCAT44(kVar4,in_stack_fffffffffffff478),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_8b0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
         (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  kVar3 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                      in_stack_fffffffffffff46c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(kVar3,in_stack_fffffffffffff470),
                    (key_type *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  for (local_8b8 = 2; local_8b8 < 10000; local_8b8 = local_8b8 + 1) {
    in_stack_fffffffffffff470 =
         HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(kVar3,in_stack_fffffffffffff470),in_stack_fffffffffffff46c);
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff5b0,(value_type *)CONCAT44(kVar2,in_stack_fffffffffffff5a8));
  }
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd1a36);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd1a43);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd1a50);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}